

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectBase.hpp
# Opt level: O0

void __thiscall
Diligent::
DeviceObjectBase<Diligent::IDeviceObject,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceObjectAttribs>
::~DeviceObjectBase(DeviceObjectBase<Diligent::IDeviceObject,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceObjectAttribs>
                    *this)

{
  void *in_RSI;
  DeviceObjectBase<Diligent::IDeviceObject,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceObjectAttribs>
  *this_local;
  
  ~DeviceObjectBase(this);
  RefCountedObject<Diligent::IDeviceObject>::operator_delete
            ((RefCountedObject<Diligent::IDeviceObject> *)this,in_RSI);
  return;
}

Assistant:

virtual ~DeviceObjectBase()
    {
        FREE(GetStringAllocator(), const_cast<Char*>(m_Desc.Name));

        if (!m_bIsDeviceInternal)
        {
            m_pDevice->Release();
        }
    }